

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  char **ppcVar9;
  uint uVar10;
  char *pcVar11;
  byte *local_40;
  char **local_38;
  
  if (ptr == end) {
    return -1;
  }
  bVar3 = false;
  local_40 = (byte *)ptr;
  local_38 = nextTokPtr;
LAB_0015998a:
  iVar7 = 0;
  iVar5 = 0;
  bVar1 = local_40[1];
  ppcVar9 = local_38;
  iVar6 = iVar5;
  if (bVar1 < 0xdc) {
    pbVar8 = local_40;
    if (bVar1 != 0) {
      if (bVar1 - 0xd8 < 4) goto switchD_001599c0_caseD_7;
      goto switchD_001599c0_caseD_1d;
    }
    iVar6 = iVar7;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*local_40)) {
    case 5:
LAB_00159e49:
      pcVar11 = end + -(long)pbVar8;
joined_r0x00159ee9:
      local_40 = pbVar8;
      iVar6 = 0;
      if ((long)pcVar11 < 2) {
        return -2;
      }
      break;
    case 6:
LAB_00159e5d:
      pcVar11 = end + -(long)pbVar8;
joined_r0x00159efa:
      local_40 = pbVar8;
      iVar6 = 0;
      if ((long)pcVar11 < 3) {
        return -2;
      }
      break;
    case 7:
switchD_001599c0_caseD_7:
      goto LAB_00159ddb;
    case 9:
    case 10:
    case 0x15:
      do {
        local_40 = pbVar8 + 2;
        if (local_40 == (byte *)end) {
          return -1;
        }
        iVar6 = iVar5;
        if (pbVar8[3] != 0) goto switchD_001599c0_caseD_8;
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*local_40);
        pbVar8 = local_40;
      } while ((bVar1 - 9 < 2) || (bVar1 == 0x15));
      if (bVar1 == 0xe) goto switchD_001599c0_caseD_e;
      break;
    case 0xe:
switchD_001599c0_caseD_e:
      pbVar8 = local_40 + 2;
      if (pbVar8 == (byte *)end) {
        return -1;
      }
      while( true ) {
        if (pbVar8[1] != 0) goto switchD_00159bd8_caseD_0;
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar8);
        uVar10 = (uint)bVar1;
        if ((uVar10 & 0xfffffffe) == 0xc) break;
        if ((0x15 < uVar10) || ((0x200600U >> (uVar10 & 0x1f) & 1) == 0))
        goto switchD_00159bd8_caseD_0;
        pbVar8 = pbVar8 + 2;
        if (pbVar8 == (byte *)end) {
          return -1;
        }
      }
      local_40 = pbVar8 + 2;
      if (local_40 == (byte *)end) {
        return -1;
      }
      do {
        bVar2 = local_40[1];
        if (bVar2 < 0xdc) {
          bVar4 = 7;
          if (3 < bVar2 - 0xd8) {
            if (bVar2 == 0) {
              bVar4 = *(byte *)((long)enc[1].scanners + (ulong)*local_40);
            }
            else {
LAB_00159bb1:
              bVar4 = 0x1d;
            }
          }
        }
        else if (bVar2 - 0xdc < 4) {
          bVar4 = 8;
        }
        else if ((bVar2 != 0xff) || (bVar4 = 0, *local_40 < 0xfe)) goto LAB_00159bb1;
        if (bVar4 == bVar1) goto LAB_00159cc9;
        pbVar8 = local_40;
        switch(bVar4) {
        case 0:
        case 1:
        case 2:
        case 8:
          goto switchD_00159bd8_caseD_0;
        case 3:
          iVar5 = little2_scanRef(enc,(char *)(local_40 + 2),end,(char **)&local_40);
          ppcVar9 = local_38;
          if (iVar5 < 1) {
            iVar6 = 0;
            if (iVar5 != 0) {
              return iVar5;
            }
            goto switchD_001599c0_caseD_8;
          }
          break;
        default:
          goto switchD_00159bd8_caseD_4;
        case 5:
          if ((long)end - (long)local_40 < 2) {
            return -2;
          }
switchD_00159bd8_caseD_4:
          local_40 = local_40 + 2;
          break;
        case 6:
          if ((long)end - (long)local_40 < 3) {
            return -2;
          }
          local_40 = local_40 + 3;
          break;
        case 7:
          if ((long)end - (long)local_40 < 4) {
            return -2;
          }
          local_40 = local_40 + 4;
        }
        if (local_40 == (byte *)end) {
          return -1;
        }
      } while( true );
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_001599c0_caseD_16;
    case 0x17:
      iVar6 = iVar5;
      if (bVar3) break;
      pbVar8 = local_40 + 2;
      if (pbVar8 == (byte *)end) {
        return -1;
      }
      bVar1 = local_40[3];
      if (bVar1 < 0xdc) {
        if (bVar1 != 0) {
          if (3 < bVar1 - 0xd8) goto LAB_00159c94;
LAB_00159ddb:
          local_40 = pbVar8;
          iVar6 = iVar5;
          if ((long)end - (long)pbVar8 < 4) {
            return -2;
          }
          break;
        }
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar8);
        if (bVar2 < 0x16) {
          if (bVar2 == 5) goto LAB_00159e49;
          if (bVar2 == 6) goto LAB_00159e5d;
          if (bVar2 != 7) goto switchD_00159d51_caseD_8;
          goto LAB_00159ddb;
        }
        if ((bVar2 != 0x16) && (bVar2 != 0x18)) {
          if (bVar2 != 0x1d) goto switchD_00159d51_caseD_8;
          goto LAB_00159c94;
        }
LAB_00159cb6:
        local_40 = local_40 + 4;
        bVar3 = true;
        goto LAB_00159ac0;
      }
      if (bVar1 == 0xff) {
        if (*pbVar8 < 0xfe) {
LAB_00159c94:
          if ((*(uint *)((long)namingBitmap +
                        (ulong)(*pbVar8 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
               >> (*pbVar8 & 0x1f) & 1) != 0) goto LAB_00159cb6;
        }
      }
      else if (3 < bVar1 - 0xdc) goto LAB_00159c94;
      goto switchD_00159d51_caseD_8;
    case 0x1d:
      goto switchD_001599c0_caseD_1d;
    }
    goto switchD_001599c0_caseD_8;
  }
  if (bVar1 == 0xff) {
    if (0xfd < *local_40) goto switchD_001599c0_caseD_8;
  }
  else if (bVar1 - 0xdc < 4) goto switchD_001599c0_caseD_8;
switchD_001599c0_caseD_1d:
  iVar6 = iVar5;
  if ((*(uint *)((long)namingBitmap +
                (ulong)(*local_40 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5))
       >> (*local_40 & 0x1f) & 1) == 0) goto switchD_001599c0_caseD_8;
switchD_001599c0_caseD_16:
  local_40 = local_40 + 2;
  goto LAB_00159ac0;
LAB_00159cc9:
  pbVar8 = local_40 + 2;
  if (pbVar8 == (byte *)end) {
    return -1;
  }
  if (local_40[3] == 0) {
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar8);
    uVar10 = (uint)bVar1;
    local_38 = ppcVar9;
    if (bVar1 < 0xb) {
      if (1 < uVar10 - 9) goto switchD_00159bd8_caseD_0;
LAB_00159d12:
      pbVar8 = local_40 + 4;
      iVar7 = 0;
      if (pbVar8 == (byte *)end) {
        return -1;
      }
      pcVar11 = end + (-4 - (long)local_40);
      while (bVar1 = pbVar8[1], bVar1 == 0) {
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar8)) {
        case 5:
          goto joined_r0x00159ee9;
        case 6:
          goto joined_r0x00159efa;
        case 7:
          goto switchD_00159d51_caseD_7;
        default:
          goto switchD_00159d51_caseD_8;
        case 9:
        case 10:
        case 0x15:
          pbVar8 = pbVar8 + 2;
          pcVar11 = pcVar11 + -2;
          if (pbVar8 == (byte *)end) {
            return -1;
          }
          break;
        case 0xb:
          goto switchD_00159d51_caseD_b;
        case 0x11:
          goto switchD_00159d51_caseD_11;
        case 0x16:
        case 0x18:
          goto switchD_00159d51_caseD_16;
        case 0x1d:
          goto switchD_00159d51_caseD_1d;
        }
      }
      if (bVar1 - 0xd8 < 4) {
switchD_00159d51_caseD_7:
        local_40 = pbVar8;
        iVar6 = 0;
        if ((long)pcVar11 < 4) {
          return -2;
        }
        goto switchD_001599c0_caseD_8;
      }
      if ((3 < bVar1 - 0xdc) && ((bVar1 != 0xff || (*pbVar8 < 0xfe)))) {
switchD_00159d51_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(*pbVar8 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[pbVar8[1]] << 5
                             )) >> (*pbVar8 & 0x1f) & 1) != 0) {
switchD_00159d51_caseD_16:
          local_40 = pbVar8 + 2;
          bVar3 = false;
LAB_00159ac0:
          local_38 = ppcVar9;
          if (local_40 == (byte *)end) {
            return -1;
          }
          goto LAB_0015998a;
        }
      }
    }
    else {
      if (bVar1 == 0x15) goto LAB_00159d12;
      if (uVar10 != 0xb) {
        if (uVar10 == 0x11) {
switchD_00159d51_caseD_11:
          local_40 = pbVar8 + 2;
          if (local_40 == (byte *)end) {
            return -1;
          }
          iVar6 = 0;
          if (pbVar8[3] == 0) {
            if (pbVar8[2] == 0x3e) {
              local_40 = pbVar8 + 4;
            }
            iVar6 = (uint)(pbVar8[2] == 0x3e) * 3;
          }
          goto switchD_001599c0_caseD_8;
        }
        goto switchD_00159bd8_caseD_0;
      }
switchD_00159d51_caseD_b:
      pbVar8 = pbVar8 + 2;
      iVar7 = 1;
    }
switchD_00159d51_caseD_8:
    local_40 = pbVar8;
    iVar6 = iVar7;
  }
  else {
switchD_00159bd8_caseD_0:
    local_40 = pbVar8;
    local_38 = ppcVar9;
    iVar6 = 0;
  }
switchD_001599c0_caseD_8:
  *local_38 = (char *)local_40;
  return iVar6;
}

Assistant:

static
int PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                     const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          if (ptr == end)
            return XML_TOK_PARTIAL;
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            if (ptr == end)
              return XML_TOK_PARTIAL;
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}